

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptCompoundStatement(HlslGrammar *this,TIntermNode **retStatement)

{
  TIntermNode *pTVar1;
  bool bVar2;
  int iVar3;
  TOperator TVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  TIntermBranch *local_48;
  TIntermBranch *branch;
  TIntermNode *statement;
  TIntermAggregate *compoundStatement;
  TIntermNode **retStatement_local;
  HlslGrammar *this_local;
  
  statement = (TIntermNode *)0x0;
  compoundStatement = (TIntermAggregate *)retStatement;
  retStatement_local = (TIntermNode **)this;
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  if (bVar2) {
    branch = (TIntermBranch *)0x0;
    while (bVar2 = acceptStatement(this,(TIntermNode **)&branch), pTVar1 = statement, bVar2) {
      if (branch == (TIntermBranch *)0x0) {
        local_48 = (TIntermBranch *)0x0;
      }
      else {
        iVar3 = (*(branch->super_TIntermNode)._vptr_TIntermNode[0xd])();
        local_48 = (TIntermBranch *)CONCAT44(extraout_var,iVar3);
      }
      if ((local_48 == (TIntermBranch *)0x0) ||
         ((TVar4 = TIntermBranch::getFlowOp(local_48), TVar4 != EOpCase &&
          (TVar4 = TIntermBranch::getFlowOp(local_48), TVar4 != EOpDefault)))) {
        statement = (TIntermNode *)
                    TIntermediate::growAggregate
                              (this->intermediate,statement,&branch->super_TIntermNode);
      }
      else {
        HlslParseContext::wrapupSwitchSubsequence
                  (this->parseContext,(TIntermAggregate *)statement,&branch->super_TIntermNode);
        statement = (TIntermNode *)0x0;
      }
    }
    if (statement != (TIntermNode *)0x0) {
      bVar2 = TIntermediate::getDebugInfo(this->intermediate);
      uVar5 = 1;
      if (bVar2) {
        uVar5 = 2;
      }
      (*pTVar1->_vptr_TIntermNode[0x31])(pTVar1,uVar5);
    }
    (compoundStatement->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
    _vptr_TIntermNode = (_func_int **)statement;
    this_local._7_1_ =
         HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptCompoundStatement(TIntermNode*& retStatement)
{
    TIntermAggregate* compoundStatement = nullptr;

    // LEFT_CURLY
    if (! acceptTokenClass(EHTokLeftBrace))
        return false;

    // statement statement ...
    TIntermNode* statement = nullptr;
    while (acceptStatement(statement)) {
        TIntermBranch* branch = statement ? statement->getAsBranchNode() : nullptr;
        if (branch != nullptr && (branch->getFlowOp() == EOpCase ||
                                  branch->getFlowOp() == EOpDefault)) {
            // hook up individual subsequences within a switch statement
            parseContext.wrapupSwitchSubsequence(compoundStatement, statement);
            compoundStatement = nullptr;
        } else {
            // hook it up to the growing compound statement
            compoundStatement = intermediate.growAggregate(compoundStatement, statement);
        }
    }
    if (compoundStatement)
        compoundStatement->setOperator(intermediate.getDebugInfo() ? EOpScope : EOpSequence);

    retStatement = compoundStatement;

    // RIGHT_CURLY
    return acceptTokenClass(EHTokRightBrace);
}